

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cc
# Opt level: O0

Vector2 AVO::anon_unknown_0::tangentPoint(Vector2 *p,float r)

{
  float *in_RDI;
  float in_XMM0_Da;
  double dVar1;
  Vector2 VVar2;
  float l;
  float pLengthSq;
  Vector2 *in_stack_ffffffffffffffc8;
  Vector2 local_24;
  float local_1c;
  float local_18;
  float local_14;
  float *local_10;
  
  local_14 = in_XMM0_Da;
  local_10 = in_RDI;
  local_18 = absSq((Vector2 *)0x107fe9);
  dVar1 = std::sqrt((double)(ulong)(uint)(local_18 - local_14 * local_14));
  local_1c = SUB84(dVar1,0);
  Vector2::Vector2(&local_24,local_1c * *local_10 - local_14 * local_10[1],
                   local_14 * *local_10 + local_1c * local_10[1]);
  VVar2 = Vector2::operator*(in_stack_ffffffffffffffc8,0.0);
  return VVar2;
}

Assistant:

Vector2 tangentPoint(const Vector2 &p, float r) {
  const float pLengthSq = absSq(p);
  const float l = std::sqrt(pLengthSq - r * r);
  return Vector2(l * p.x_ - r * p.y_, r * p.x_ + l * p.y_) * (l / pLengthSq);
}